

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall VertexClustering::~VertexClustering(VertexClustering *this)

{
  pointer ppVVar1;
  VCCluster *pVVar2;
  VertexGroup *pVVar3;
  int i;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    ppVVar1 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3) <= uVar4)
    break;
    pVVar2 = ppVVar1[uVar4];
    if (pVVar2 != (VCCluster *)0x0) {
      (*pVVar2->_vptr_VCCluster[3])();
    }
    uVar4 = uVar4 + 1;
  }
  pVVar3 = this->vGroup;
  if (pVVar3 != (VertexGroup *)0x0) {
    VertexGroup::~VertexGroup(pVVar3);
  }
  operator_delete(pVVar3);
  pVVar3 = this->vGroupNew;
  if (pVVar3 != (VertexGroup *)0x0) {
    VertexGroup::~VertexGroup(pVVar3);
    operator_delete(pVVar3);
  }
  std::_Deque_base<VCEdge,_std::allocator<VCEdge>_>::~_Deque_base
            ((_Deque_base<VCEdge,_std::allocator<VCEdge>_> *)&this->boundary);
  std::
  _Rb_tree<VCPair,_std::pair<const_VCPair,_VCEdge>,_std::_Select1st<std::pair<const_VCPair,_VCEdge>_>,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
  ::~_Rb_tree(&(this->edgeMap)._M_t);
  std::_Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>::~_Vector_base
            (&(this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>);
  return;
}

Assistant:

VertexClustering::~VertexClustering(void)
{
	for (int i = 0; i < clusters.size(); i++)
		delete clusters[i];
	delete vGroup;
	if (vGroupNew)
		delete vGroupNew;
}